

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::show_recursive(QWidgetPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidgetPrivate *pQVar3;
  QWidgetPrivate *in_RDI;
  QWidget *q;
  QWidget *in_stack_00000018;
  QLayout *in_stack_00000060;
  
  pQVar3 = in_RDI;
  pQVar2 = q_func(in_RDI);
  bVar1 = QWidget::testAttribute((QWidget *)pQVar3,(WidgetAttribute)((ulong)pQVar2 >> 0x20));
  if (!bVar1) {
    createRecursively(this);
  }
  QWidget::ensurePolished(in_stack_00000018);
  bVar1 = QWidget::isWindow(pQVar2);
  if (!bVar1) {
    QWidget::parentWidget((QWidget *)0x37899e);
    pQVar3 = QWidget::d_func((QWidget *)0x3789a6);
    if (pQVar3->layout != (QLayout *)0x0) {
      pQVar2 = QWidget::parentWidget((QWidget *)0x3789ba);
      if ((*(uint *)&pQVar2->data->field_0x10 >> 10 & 1) == 0) {
        QWidget::parentWidget((QWidget *)0x3789d6);
        QWidget::d_func((QWidget *)0x3789de);
        QLayout::activate(in_stack_00000060);
      }
    }
  }
  if (in_RDI->layout != (QLayout *)0x0) {
    QLayout::activate(in_stack_00000060);
  }
  show_helper(this);
  return;
}

Assistant:

void QWidgetPrivate::show_recursive()
{
    Q_Q(QWidget);
    // polish if necessary

    if (!q->testAttribute(Qt::WA_WState_Created))
        createRecursively();
    q->ensurePolished();

    if (!q->isWindow() && q->parentWidget()->d_func()->layout && !q->parentWidget()->data->in_show)
        q->parentWidget()->d_func()->layout->activate();
    // activate our layout before we and our children become visible
    if (layout)
        layout->activate();

    show_helper();
}